

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

ArgMinLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_argmin(NeuralNetworkLayer *this)

{
  ulong uVar1;
  ArgMinLayerParams *pAVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x3fc) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3fc;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pAVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArgMinLayerParams>
                       (arena);
    (this->layer_).argmin_ = pAVar2;
  }
  return (ArgMinLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ArgMinLayerParams* NeuralNetworkLayer::_internal_mutable_argmin() {
  if (!_internal_has_argmin()) {
    clear_layer();
    set_has_argmin();
    layer_.argmin_ = CreateMaybeMessage< ::CoreML::Specification::ArgMinLayerParams >(GetArenaForAllocation());
  }
  return layer_.argmin_;
}